

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

_Bool arena_decay_impl(tsdn_t *tsdn,arena_t *arena,arena_decay_t *decay,extents_t *extents,
                      _Bool is_background_thread,_Bool all)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  _Bool _Var3;
  int iVar4;
  size_t npages_decay_max;
  mutex_prof_data_t *data;
  uint7 in_register_00000089;
  size_t npages_new;
  
  __mutex = (pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x40);
  iVar4 = pthread_mutex_trylock(__mutex);
  if ((int)CONCAT71(in_register_00000089,all) == 0) {
    if (iVar4 == 0) {
      puVar1 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
        (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
        ppwVar2 = &(decay->mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
    }
    else {
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    npages_new = CONCAT71(in_register_00000089 & 0xffffff,1);
    if (iVar4 == 0) {
      _Var3 = arena_maybe_decay(tsdn,arena,decay,extents,is_background_thread);
      if (_Var3) {
        npages_new = decay->backlog[199];
      }
      (decay->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(__mutex);
      if ((_Var3 & background_thread_enabled_state.repr) == 1 && !is_background_thread) {
        background_thread_interval_check(tsdn,arena,decay,npages_new);
      }
      npages_new = 0;
    }
  }
  else {
    if (iVar4 != 0) {
      malloc_mutex_lock_slow(&decay->mtx);
      (decay->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(decay->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((decay->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (decay->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(decay->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    npages_decay_max = extents_npages_get(extents);
    npages_new = 0;
    arena_decay_to_limit(tsdn,arena,decay,extents,true,0,npages_decay_max,is_background_thread);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  return SUB81(npages_new,0);
}

Assistant:

static bool
arena_decay_impl(tsdn_t *tsdn, arena_t *arena, arena_decay_t *decay,
    extents_t *extents, bool is_background_thread, bool all) {
	if (all) {
		malloc_mutex_lock(tsdn, &decay->mtx);
		arena_decay_to_limit(tsdn, arena, decay, extents, all, 0,
		    extents_npages_get(extents), is_background_thread);
		malloc_mutex_unlock(tsdn, &decay->mtx);

		return false;
	}

	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* No need to wait if another thread is in progress. */
		return true;
	}

	bool epoch_advanced = arena_maybe_decay(tsdn, arena, decay, extents,
	    is_background_thread);
	size_t npages_new;
	if (epoch_advanced) {
		/* Backlog is updated on epoch advance. */
		npages_new = decay->backlog[SMOOTHSTEP_NSTEPS-1];
	}
	malloc_mutex_unlock(tsdn, &decay->mtx);

	if (have_background_thread && background_thread_enabled() &&
	    epoch_advanced && !is_background_thread) {
		background_thread_interval_check(tsdn, arena, decay,
		    npages_new);
	}

	return false;
}